

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeIntError
DivisionHelper<unsigned_long,_int,_1>::Divide(unsigned_long *t,int *u,unsigned_long *result)

{
  uint32_t uVar1;
  ulong *in_RDX;
  int *in_RSI;
  ulong *in_RDI;
  undefined4 local_4;
  
  if (*in_RSI == 0) {
    local_4 = SafeIntDivideByZero;
  }
  else if (*in_RDI == 0) {
    *in_RDX = 0;
    local_4 = SafeIntNoError;
  }
  else if (*in_RSI < 1) {
    uVar1 = AbsValueHelper<int,_0>::Abs(0);
    if (*in_RDI < (ulong)uVar1) {
      *in_RDX = 0;
      local_4 = SafeIntNoError;
    }
    else {
      local_4 = SafeIntArithmeticOverflow;
    }
  }
  else {
    *in_RDX = *in_RDI / (ulong)(long)*in_RSI;
    local_4 = SafeIntNoError;
  }
  return local_4;
}

Assistant:

static SafeIntError Divide( const T& t, const U& u, T& result ) SAFEINT_NOTHROW
    {

        if( u == 0 )
            return SafeIntDivideByZero;

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return SafeIntNoError;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return SafeIntNoError;
        }

        return SafeIntArithmeticOverflow;
    }